

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_time_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_577d4e::X509TimeTest_TestCmpTimeCurrent_Test::TestBody
          (X509TimeTest_TestCmpTimeCurrent_Test *this)

{
  bool bVar1;
  time_t t;
  ASN1_TIME *pAVar2;
  pointer paVar3;
  char *pcVar4;
  AssertHelper local_90;
  Message local_88;
  int local_80 [2];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58;
  int local_50 [2];
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_28;
  UniquePtr<ASN1_TIME> asn1_after;
  UniquePtr<ASN1_TIME> asn1_before;
  time_t now;
  X509TimeTest_TestCmpTimeCurrent_Test *this_local;
  
  t = time((time_t *)0x0);
  pAVar2 = ASN1_TIME_adj((ASN1_TIME *)0x0,t,-1,0);
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&asn1_after,(pointer)pAVar2);
  pAVar2 = ASN1_TIME_adj((ASN1_TIME *)0x0,t,1,0);
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&local_28,(pointer)pAVar2);
  local_50[1] = 0xffffffff;
  paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&asn1_after);
  local_50[0] = X509_cmp_time((ASN1_TIME *)paVar3,(time_t *)0x0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_48,"-1","X509_cmp_time(asn1_before.get(), __null)",local_50 + 1,
             local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_time_test.cc"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(&local_58);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_80[1] = 1;
    paVar3 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_28);
    local_80[0] = X509_cmp_time((ASN1_TIME *)paVar3,(time_t *)0x0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_78,"1","X509_cmp_time(asn1_after.get(), __null)",local_80 + 1,
               local_80);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_88);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_time_test.cc"
                 ,0x142,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::Message::~Message(&local_88);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&asn1_after);
  return;
}

Assistant:

TEST(X509TimeTest, TestCmpTimeCurrent) {
  time_t now = time(NULL);
  // Pick a day earlier and later, relative to any system clock.
  bssl::UniquePtr<ASN1_TIME> asn1_before(ASN1_TIME_adj(NULL, now, -1, 0));
  bssl::UniquePtr<ASN1_TIME> asn1_after(ASN1_TIME_adj(NULL, now, 1, 0));

  ASSERT_EQ(-1, X509_cmp_time(asn1_before.get(), NULL));
  ASSERT_EQ(1, X509_cmp_time(asn1_after.get(), NULL));
}